

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void PathBezierToCasteljau
               (ImVector<ImVec2> *path,float x1,float y1,float x2,float y2,float x3,float y3,
               float x4,float y4,float tess_tol,int level)

{
  float in_ESI;
  float in_XMM0_Da;
  float y4_00;
  float level_00;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  float in_XMM4_Da;
  float in_XMM5_Da;
  float in_XMM6_Da;
  float in_XMM7_Da;
  float unaff_retaddr;
  float in_stack_00000008;
  float y1234;
  float x1234;
  float y234;
  float x234;
  float y123;
  float x123;
  float y34;
  float x34;
  float y23;
  float x23;
  float y12;
  float x12;
  float d3;
  float d2;
  float dy;
  float dx;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  ImVector<ImVec2> *in_stack_ffffffffffffff70;
  float local_7c;
  float local_78;
  ImVec2 local_44;
  float local_3c;
  float local_38;
  
  y4_00 = in_XMM6_Da - in_XMM0_Da;
  level_00 = in_XMM7_Da - in_XMM1_Da;
  local_78 = (in_XMM2_Da - in_XMM6_Da) * level_00 + -((in_XMM3_Da - in_XMM7_Da) * y4_00);
  local_7c = (in_XMM4_Da - in_XMM6_Da) * level_00 + -((in_XMM5_Da - in_XMM7_Da) * y4_00);
  if (local_78 < 0.0) {
    local_78 = -local_78;
  }
  local_38 = local_78;
  if (local_7c < 0.0) {
    local_7c = -local_7c;
  }
  local_3c = local_7c;
  if (in_stack_00000008 * (y4_00 * y4_00 + level_00 * level_00) <=
      (local_78 + local_7c) * (local_78 + local_7c)) {
    if ((int)in_ESI < 10) {
      PathBezierToCasteljau
                ((ImVector<ImVec2> *)CONCAT44(in_XMM0_Da,in_XMM1_Da),in_XMM2_Da,in_XMM3_Da,
                 in_XMM4_Da,in_XMM5_Da,in_XMM6_Da,in_XMM7_Da,in_ESI,y4_00,unaff_retaddr,
                 (int)level_00);
      PathBezierToCasteljau
                ((ImVector<ImVec2> *)CONCAT44(in_XMM0_Da,in_XMM1_Da),in_XMM2_Da,in_XMM3_Da,
                 in_XMM4_Da,in_XMM5_Da,in_XMM6_Da,in_XMM7_Da,in_ESI,y4_00,unaff_retaddr,
                 (int)level_00);
    }
  }
  else {
    ImVec2::ImVec2(&local_44,in_XMM6_Da,in_XMM7_Da);
    ImVector<ImVec2>::push_back
              (in_stack_ffffffffffffff70,
               (ImVec2 *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  }
  return;
}

Assistant:

static void PathBezierToCasteljau(ImVector<ImVec2>* path, float x1, float y1, float x2, float y2, float x3, float y3, float x4, float y4, float tess_tol, int level)
{
    float dx = x4 - x1;
    float dy = y4 - y1;
    float d2 = ((x2 - x4) * dy - (y2 - y4) * dx);
    float d3 = ((x3 - x4) * dy - (y3 - y4) * dx);
    d2 = (d2 >= 0) ? d2 : -d2;
    d3 = (d3 >= 0) ? d3 : -d3;
    if ((d2 + d3) * (d2 + d3) < tess_tol * (dx * dx + dy * dy))
    {
        path->push_back(ImVec2(x4, y4));
    }
    else if (level < 10)
    {
        float x12 = (x1 + x2)*0.5f,       y12 = (y1 + y2)*0.5f;
        float x23 = (x2 + x3)*0.5f,       y23 = (y2 + y3)*0.5f;
        float x34 = (x3 + x4)*0.5f,       y34 = (y3 + y4)*0.5f;
        float x123 = (x12 + x23)*0.5f,    y123 = (y12 + y23)*0.5f;
        float x234 = (x23 + x34)*0.5f,    y234 = (y23 + y34)*0.5f;
        float x1234 = (x123 + x234)*0.5f, y1234 = (y123 + y234)*0.5f;
        PathBezierToCasteljau(path, x1, y1,        x12, y12,    x123, y123,  x1234, y1234, tess_tol, level + 1);
        PathBezierToCasteljau(path, x1234, y1234,  x234, y234,  x34, y34,    x4, y4,       tess_tol, level + 1);
    }
}